

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_ignorm(double *c1,double *c2,int m,double g)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  if ((g != 0.0) || (NAN(g))) {
    dVar4 = pow(*c1,g);
    if (0 < m) {
      uVar1 = (ulong)(uint)m + 1;
      do {
        c2[uVar1 - 1] = c1[uVar1 - 1] * dVar4;
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
    dVar4 = (dVar4 + -1.0) / g;
  }
  else {
    lVar2 = (long)m;
    if (c2 < c1) {
      if (m != 0) {
        lVar3 = 0;
        do {
          c2[lVar3 + 1] = c1[lVar3 + 1];
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
    }
    else if (m != 0) {
      do {
        c2[lVar2] = c1[lVar2];
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    dVar4 = log(*c1);
  }
  *c2 = dVar4;
  return;
}

Assistant:

static void HTS_ignorm(double *c1, double *c2, int m, const double g)
{
   double k;
   if (g != 0.0) {
      k = pow(c1[0], g);
      for (; m >= 1; m--)
         c2[m] = k * c1[m];
      c2[0] = (k - 1.0) / g;
   } else {
      HTS_movem(&c1[1], &c2[1], m);
      c2[0] = log(c1[0]);
   }
}